

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

int __thiscall doctest::Context::run(Context *this)

{
  ContextState *pCVar1;
  IReporter *pIVar2;
  TestCase *this_00;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  reference pvVar9;
  reporterMap *prVar10;
  set<doctest::detail::TestCase,_std::less<doctest::detail::TestCase>,_std::allocator<doctest::detail::TestCase>_>
  *this_01;
  size_type sVar11;
  iterator iVar12;
  iterator iVar13;
  reference ppTVar14;
  ulong uVar15;
  reference ppTVar16;
  size_type sVar17;
  reference ppIVar18;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *pvVar19;
  long in_FS_OFFSET;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *local_710;
  byte local_681;
  ostream *local_5e8;
  anon_class_1_0_00000001 local_5c9;
  reference ppIStack_5c8;
  anon_class_1_0_00000001 DOCTEST_FIX_FOR_MACOS_LIBCPP_IOSFWD_STRING_LINK_ERRORS;
  IReporter **curr_rep_8;
  iterator __end2_3;
  iterator __begin2_3;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range2_3;
  QueryData qdata;
  IReporter **curr_rep_7;
  iterator __end2_2;
  iterator __begin2_2;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range2_2;
  IReporter **curr_rep_6;
  iterator __end3_1;
  iterator __begin3_1;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range3_1;
  IReporter **curr_rep_5;
  iterator __end5_1;
  iterator __begin5_1;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range5_1;
  TestFailureException *anon_var_0;
  IReporter **curr_rep_4;
  iterator __end5;
  iterator __begin5;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range5;
  FatalConditionHandler fatalConditionHandler;
  reference ppIStack_4e0;
  bool run_test;
  IReporter **curr_rep_3;
  iterator __end3;
  iterator __begin3;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range3;
  String local_4b0;
  TestCase *local_498;
  String local_490;
  TestCase *local_478;
  reference local_470;
  IReporter **curr_rep_2;
  iterator __end4;
  iterator __begin4;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range4;
  bool skip_me;
  TestCase *tc;
  TestCase **curr_3;
  iterator __end1_3;
  iterator __begin1_3;
  vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
  *__range1_3;
  IReporter **curr_rep_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range2_1;
  vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_> queryResults
  ;
  undefined1 local_3e0 [7];
  bool query_mode;
  set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  testSuitesPassingFilt;
  value_type temp;
  ulong uStack_3a0;
  int idxToSwap;
  size_t i;
  value_type *first;
  reference local_360;
  reference local_358;
  TestCase *curr_2;
  iterator __end1_2;
  iterator __begin1_2;
  set<doctest::detail::TestCase,_std::less<doctest::detail::TestCase>,_std::allocator<doctest::detail::TestCase>_>
  *__range1_2;
  vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
  testArray;
  QueryData local_318;
  reference local_2f8;
  IReporter **curr_rep;
  iterator __end2;
  iterator __begin2;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range2;
  IReporter *local_2d0;
  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
  local_2c8;
  const_iterator local_2c0;
  reference local_2b8;
  pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
  *curr_1;
  iterator __end1_1;
  iterator __begin1_1;
  reporterMap *__range1_1;
  reference local_290;
  pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
  *curr;
  iterator __end1;
  iterator __begin1;
  reporterMap *__range1;
  undefined1 local_258 [8];
  anon_class_24_3_e7807fc8 cleanup_and_return;
  fstream local_230 [8];
  fstream fstr;
  ostream aoStack_220 [512];
  ContextState *local_20;
  ContextState *old_cs;
  Context *this_local;
  
  local_20 = detail::g_cs;
  detail::g_cs = this->p;
  is_running_in_test = 1;
  *(byte *)(in_FS_OFFSET + -0x38) = (this->p->super_ContextOptions).no_colors & 1;
  old_cs = (ContextState *)this;
  detail::ContextState::resetRunData(this->p);
  (this->p->super_ContextOptions).cout = (ostream *)&std::cout;
  (this->p->super_ContextOptions).cerr = (ostream *)&std::cerr;
  std::fstream::fstream(local_230);
  uVar5 = String::size(&(this->p->super_ContextOptions).out);
  if (uVar5 != 0) {
    pcVar8 = String::c_str(&(this->p->super_ContextOptions).out);
    std::fstream::open((char *)local_230,(_Ios_Openmode)pcVar8);
    local_5e8 = (ostream *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x230) {
      local_5e8 = aoStack_220;
    }
    (this->p->super_ContextOptions).cout = local_5e8;
  }
  anon_unknown_14::FatalConditionHandler::allocateAltStackMem();
  local_258 = (undefined1  [8])local_230;
  cleanup_and_return.fstr = (fstream *)&local_20;
  cleanup_and_return.old_cs = &this->p;
  pvVar9 = std::
           vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ::operator[](&this->p->filters,8);
  bVar3 = std::vector<doctest::String,_std::allocator<doctest::String>_>::empty(pvVar9);
  if (bVar3) {
    pvVar9 = std::
             vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ::operator[](&this->p->filters,8);
    String::String((String *)&__range1,"console");
    std::vector<doctest::String,_std::allocator<doctest::String>_>::push_back
              (pvVar9,(value_type *)&__range1);
    String::~String((String *)&__range1);
  }
  prVar10 = anon_unknown_14::getReporters();
  __end1 = std::
           map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
           ::begin(prVar10);
  curr = (pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
          *)std::
            map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
            ::end(prVar10);
  while (bVar3 = std::operator!=(&__end1,(_Self *)&curr), bVar3) {
    local_290 = std::
                _Rb_tree_iterator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>
                ::operator*(&__end1);
    pcVar8 = String::c_str(&(local_290->first).second);
    pvVar9 = std::
             vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ::operator[](&this->p->filters,8);
    bVar3 = anon_unknown_14::matchesAny
                      (pcVar8,pvVar9,false,
                       (bool)((this->p->super_ContextOptions).case_sensitive & 1));
    if (bVar3) {
      pCVar1 = this->p;
      __range1_1 = (reporterMap *)(*local_290->second)(&detail::g_cs->super_ContextOptions);
      std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::push_back
                (&pCVar1->reporters_currently_used,(value_type *)&__range1_1);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>
    ::operator++(&__end1);
  }
  prVar10 = anon_unknown_14::getListeners();
  __end1_1 = std::
             map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
             ::begin(prVar10);
  curr_1 = (pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
            *)std::
              map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
              ::end(prVar10);
  while (bVar3 = std::operator!=(&__end1_1,(_Self *)&curr_1), bVar3) {
    local_2b8 = std::
                _Rb_tree_iterator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>
                ::operator*(&__end1_1);
    pvVar19 = &this->p->reporters_currently_used;
    local_2c8._M_current =
         (IReporter **)
         std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin(pvVar19);
    __gnu_cxx::
    __normal_iterator<doctest::IReporter*const*,std::vector<doctest::IReporter*,std::allocator<doctest::IReporter*>>>
    ::__normal_iterator<doctest::IReporter**>
              ((__normal_iterator<doctest::IReporter*const*,std::vector<doctest::IReporter*,std::allocator<doctest::IReporter*>>>
                *)&local_2c0,&local_2c8);
    local_2d0 = (*local_2b8->second)(&detail::g_cs->super_ContextOptions);
    std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::insert
              (pvVar19,local_2c0,&local_2d0);
    std::
    _Rb_tree_iterator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>
    ::operator++(&__end1_1);
  }
  if ((((((this->p->super_ContextOptions).no_run & 1U) == 0) &&
       (((this->p->super_ContextOptions).version & 1U) == 0)) &&
      (((this->p->super_ContextOptions).help & 1U) == 0)) &&
     (((this->p->super_ContextOptions).list_reporters & 1U) == 0)) {
    std::
    vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>::
    vector((vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
            *)&__range1_2);
    this_01 = detail::getRegisteredTests();
    __end1_2 = std::
               set<doctest::detail::TestCase,_std::less<doctest::detail::TestCase>,_std::allocator<doctest::detail::TestCase>_>
               ::begin(this_01);
    curr_2 = (TestCase *)
             std::
             set<doctest::detail::TestCase,_std::less<doctest::detail::TestCase>,_std::allocator<doctest::detail::TestCase>_>
             ::end(this_01);
    while (bVar3 = std::operator!=(&__end1_2,(_Self *)&curr_2), bVar3) {
      local_360 = std::_Rb_tree_const_iterator<doctest::detail::TestCase>::operator*(&__end1_2);
      local_358 = local_360;
      std::
      vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
      ::push_back((vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                   *)&__range1_2,&local_360);
      std::_Rb_tree_const_iterator<doctest::detail::TestCase>::operator++(&__end1_2);
    }
    sVar11 = std::
             vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
             ::size((vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                     *)&__range1_2);
    *(int *)&(this->p->super_ContextOptions).field_0x8c = (int)sVar11;
    bVar3 = std::
            vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
            ::empty((vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                     *)&__range1_2);
    if (!bVar3) {
      iVar6 = String::compare(&(this->p->super_ContextOptions).order_by,"file",true);
      if (iVar6 == 0) {
        iVar12 = std::
                 vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                 ::begin((vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                          *)&__range1_2);
        iVar13 = std::
                 vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                 ::end((vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                        *)&__range1_2);
        std::
        sort<__gnu_cxx::__normal_iterator<doctest::detail::TestCase_const**,std::vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>>,bool(*)(doctest::detail::TestCase_const*,doctest::detail::TestCase_const*)>
                  ((__normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
                    )iVar12._M_current,
                   (__normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
                    )iVar13._M_current,anon_unknown_14::fileOrderComparator);
      }
      else {
        iVar6 = String::compare(&(this->p->super_ContextOptions).order_by,"suite",true);
        if (iVar6 == 0) {
          iVar12 = std::
                   vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                   ::begin((vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                            *)&__range1_2);
          iVar13 = std::
                   vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                   ::end((vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                          *)&__range1_2);
          std::
          sort<__gnu_cxx::__normal_iterator<doctest::detail::TestCase_const**,std::vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>>,bool(*)(doctest::detail::TestCase_const*,doctest::detail::TestCase_const*)>
                    ((__normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
                      )iVar12._M_current,
                     (__normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
                      )iVar13._M_current,anon_unknown_14::suiteOrderComparator);
        }
        else {
          iVar6 = String::compare(&(this->p->super_ContextOptions).order_by,"name",true);
          if (iVar6 == 0) {
            iVar12 = std::
                     vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                     ::begin((vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                              *)&__range1_2);
            iVar13 = std::
                     vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                     ::end((vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                            *)&__range1_2);
            std::
            sort<__gnu_cxx::__normal_iterator<doctest::detail::TestCase_const**,std::vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>>,bool(*)(doctest::detail::TestCase_const*,doctest::detail::TestCase_const*)>
                      ((__normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
                        )iVar12._M_current,
                       (__normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
                        )iVar13._M_current,anon_unknown_14::nameOrderComparator);
          }
          else {
            iVar6 = String::compare(&(this->p->super_ContextOptions).order_by,"rand",true);
            if (iVar6 == 0) {
              srand((this->p->super_ContextOptions).rand_seed);
              ppTVar14 = std::
                         vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                         ::operator[]((vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                                       *)&__range1_2,0);
              uVar15 = std::
                       vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                       ::size((vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                               *)&__range1_2);
              while (uStack_3a0 = uVar15 - 1, uStack_3a0 != 0) {
                iVar6 = rand();
                iVar6 = (int)((ulong)(long)iVar6 % uVar15);
                testSuitesPassingFilt._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     (size_t)ppTVar14[uStack_3a0];
                ppTVar14[uStack_3a0] = ppTVar14[iVar6];
                ppTVar14[iVar6] =
                     (value_type)
                     testSuitesPassingFilt._M_t._M_impl.super__Rb_tree_header._M_node_count;
                uVar15 = uStack_3a0;
              }
            }
            else {
              String::compare(&(this->p->super_ContextOptions).order_by,"none",true);
            }
          }
        }
      }
    }
    std::set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>::set
              ((set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_> *
               )local_3e0);
    local_681 = 1;
    if ((((this->p->super_ContextOptions).count & 1U) == 0) &&
       (local_681 = 1, ((this->p->super_ContextOptions).list_test_cases & 1U) == 0)) {
      local_681 = (this->p->super_ContextOptions).list_test_suites;
    }
    queryResults.
    super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = local_681 & 1;
    std::vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>::
    vector((vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_> *)
           &__range2_1);
    if ((queryResults.
         super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
      pvVar19 = &detail::g_cs->reporters_currently_used;
      __end2_1 = std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                           (pvVar19);
      curr_rep_1 = (IReporter **)
                   std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end
                             (pvVar19);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                 *)&curr_rep_1), bVar3) {
        ppIVar18 = __gnu_cxx::
                   __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                   ::operator*(&__end2_1);
        (*(*ppIVar18)->_vptr_IReporter[1])();
        __gnu_cxx::
        __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
        ::operator++(&__end2_1);
      }
    }
    __end1_3 = std::
               vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
               ::begin((vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                        *)&__range1_2);
    curr_3 = (TestCase **)
             std::
             vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
             ::end((vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                    *)&__range1_2);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1_3,
                              (__normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
                               *)&curr_3), bVar3) {
      ppTVar16 = __gnu_cxx::
                 __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
                 ::operator*(&__end1_3);
      this_00 = *ppTVar16;
      bVar3 = false;
      if (((*(byte *)((long)&this_00->super_TestCaseData + 0x38) & 1) != 0) &&
         (((this->p->super_ContextOptions).no_skip & 1U) == 0)) {
        bVar3 = true;
      }
      pcVar8 = String::c_str((String *)this_00);
      pvVar9 = std::
               vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
               ::operator[](&this->p->filters,0);
      bVar4 = anon_unknown_14::matchesAny
                        (pcVar8,pvVar9,true,
                         (bool)((this->p->super_ContextOptions).case_sensitive & 1));
      if (!bVar4) {
        bVar3 = true;
      }
      pcVar8 = String::c_str((String *)this_00);
      pvVar9 = std::
               vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
               ::operator[](&this->p->filters,1);
      bVar4 = anon_unknown_14::matchesAny
                        (pcVar8,pvVar9,false,
                         (bool)((this->p->super_ContextOptions).case_sensitive & 1));
      if (bVar4) {
        bVar3 = true;
      }
      pcVar8 = *(char **)((long)&this_00->super_TestCaseData + 0x28);
      pvVar9 = std::
               vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
               ::operator[](&this->p->filters,2);
      bVar4 = anon_unknown_14::matchesAny
                        (pcVar8,pvVar9,true,
                         (bool)((this->p->super_ContextOptions).case_sensitive & 1));
      if (!bVar4) {
        bVar3 = true;
      }
      pcVar8 = *(char **)((long)&this_00->super_TestCaseData + 0x28);
      pvVar9 = std::
               vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
               ::operator[](&this->p->filters,3);
      bVar4 = anon_unknown_14::matchesAny
                        (pcVar8,pvVar9,false,
                         (bool)((this->p->super_ContextOptions).case_sensitive & 1));
      if (bVar4) {
        bVar3 = true;
      }
      pcVar8 = *(char **)((long)&this_00->super_TestCaseData + 0x20);
      pvVar9 = std::
               vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
               ::operator[](&this->p->filters,4);
      bVar4 = anon_unknown_14::matchesAny
                        (pcVar8,pvVar9,true,
                         (bool)((this->p->super_ContextOptions).case_sensitive & 1));
      if (!bVar4) {
        bVar3 = true;
      }
      pcVar8 = *(char **)((long)&this_00->super_TestCaseData + 0x20);
      pvVar9 = std::
               vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
               ::operator[](&this->p->filters,5);
      bVar4 = anon_unknown_14::matchesAny
                        (pcVar8,pvVar9,false,
                         (bool)((this->p->super_ContextOptions).case_sensitive & 1));
      if (bVar4) {
        bVar3 = true;
      }
      if (!bVar3) {
        *(int *)&this->p->field_0x90 = *(int *)&this->p->field_0x90 + 1;
      }
      if ((((this->p->super_ContextOptions).last < *(uint *)&this->p->field_0x90) &&
          ((this->p->super_ContextOptions).first <= (this->p->super_ContextOptions).last)) ||
         (*(uint *)&this->p->field_0x90 < (this->p->super_ContextOptions).first)) {
        bVar3 = true;
      }
      if (bVar3) {
        if ((queryResults.
             super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
          pvVar19 = &detail::g_cs->reporters_currently_used;
          __end4 = std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                             (pvVar19);
          curr_rep_2 = (IReporter **)
                       std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end
                                 (pvVar19);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                             *)&curr_rep_2), bVar3) {
            local_470 = __gnu_cxx::
                        __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                        ::operator*(&__end4);
            (*(*local_470)->_vptr_IReporter[0xb])(*local_470,this_00);
            __gnu_cxx::
            __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
            ::operator++(&__end4);
          }
        }
      }
      else if (((this->p->super_ContextOptions).count & 1U) == 0) {
        if (((this->p->super_ContextOptions).list_test_cases & 1U) == 0) {
          if (((this->p->super_ContextOptions).list_test_suites & 1U) == 0) {
            (this->p->super_ContextOptions).currentTest = this_00;
            (this->p->super_CurrentTestCaseStats).failure_flags = 0;
            (this->p->super_CurrentTestCaseStats).seconds = 0.0;
            detail::MultiLaneAtomic<int>::operator=(&this->p->numAssertsFailedCurrentTest_atomic,0);
            detail::MultiLaneAtomic<int>::operator=(&this->p->numAssertsCurrentTest_atomic,0);
            std::
            set<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::less<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::allocator<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>_>
            ::clear(&this->p->subcasesPassed);
            pvVar19 = &detail::g_cs->reporters_currently_used;
            __end3 = std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                               (pvVar19);
            curr_rep_3 = (IReporter **)
                         std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::
                         end(pvVar19);
            while (bVar3 = __gnu_cxx::operator!=
                                     (&__end3,(__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                               *)&curr_rep_3), bVar3) {
              ppIStack_4e0 = __gnu_cxx::
                             __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                             ::operator*(&__end3);
              (*(*ppIStack_4e0)->_vptr_IReporter[3])(*ppIStack_4e0,this_00);
              __gnu_cxx::
              __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
              ::operator++(&__end3);
            }
            detail::Timer::start(&this->p->timer);
            __range5._7_1_ = 1;
            do {
              this->p->should_reenter = false;
              this->p->subcasesCurrentMaxLevel = 0;
              std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::
              clear(&this->p->subcasesStack);
              std::atomic<bool>::operator=(&this->p->shouldLogCurrentException,true);
              std::vector<doctest::String,_std::allocator<doctest::String>_>::clear
                        (&this->p->stringifiedContexts);
              anon_unknown_14::FatalConditionHandler::FatalConditionHandler
                        ((FatalConditionHandler *)((long)&__range5 + 6));
              (*this_00->m_test)();
              anon_unknown_14::FatalConditionHandler::reset();
              anon_unknown_14::FatalConditionHandler::~FatalConditionHandler
                        ((FatalConditionHandler *)((long)&__range5 + 6));
              if ((0 < (this->p->super_ContextOptions).abort_after) &&
                 (iVar6 = *(int *)&this->p->field_0xa0,
                 iVar7 = detail::MultiLaneAtomic::operator_cast_to_int
                                   ((MultiLaneAtomic *)&this->p->numAssertsFailedCurrentTest_atomic)
                 , (this->p->super_ContextOptions).abort_after <= iVar6 + iVar7)) {
                __range5._7_1_ = 0;
                (this->p->super_CurrentTestCaseStats).failure_flags =
                     (this->p->super_CurrentTestCaseStats).failure_flags | 8;
              }
              if (((this->p->should_reenter & 1U) != 0) && ((__range5._7_1_ & 1) != 0)) {
                pvVar19 = &detail::g_cs->reporters_currently_used;
                __end5_1 = std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                           ::begin(pvVar19);
                curr_rep_5 = (IReporter **)
                             std::
                             vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::
                             end(pvVar19);
                while (bVar3 = __gnu_cxx::operator!=
                                         (&__end5_1,
                                          (__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                           *)&curr_rep_5), bVar3) {
                  ppIVar18 = __gnu_cxx::
                             __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                             ::operator*(&__end5_1);
                  (*(*ppIVar18)->_vptr_IReporter[4])(*ppIVar18,this_00);
                  __gnu_cxx::
                  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                  ::operator++(&__end5_1);
                }
              }
              if ((this->p->should_reenter & 1U) == 0) {
                __range5._7_1_ = 0;
              }
            } while ((__range5._7_1_ & 1) != 0);
            detail::ContextState::finalizeTestCaseData(this->p);
            pvVar19 = &detail::g_cs->reporters_currently_used;
            __end3_1 = std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::
                       begin(pvVar19);
            curr_rep_6 = (IReporter **)
                         std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::
                         end(pvVar19);
            while (bVar3 = __gnu_cxx::operator!=
                                     (&__end3_1,
                                      (__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                       *)&curr_rep_6), bVar3) {
              ppIVar18 = __gnu_cxx::
                         __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                         ::operator*(&__end3_1);
              (*(*ppIVar18)->_vptr_IReporter[5])
                        (*ppIVar18,&detail::g_cs->super_CurrentTestCaseStats);
              __gnu_cxx::
              __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
              ::operator++(&__end3_1);
            }
            (this->p->super_ContextOptions).currentTest = (TestCase *)0x0;
            if ((0 < (this->p->super_ContextOptions).abort_after) &&
               ((this->p->super_ContextOptions).abort_after <= *(int *)&this->p->field_0xa0)) break;
          }
          else {
            String::String(&local_490,*(char **)((long)&this_00->super_TestCaseData + 0x28));
            sVar17 = std::
                     set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                     ::count((set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                              *)local_3e0,&local_490);
            bVar3 = false;
            if (sVar17 == 0) {
              bVar3 = **(char **)((long)&this_00->super_TestCaseData + 0x28) != '\0';
            }
            String::~String(&local_490);
            if (bVar3) {
              local_498 = this_00;
              std::
              vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
              ::push_back((vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                           *)&__range2_1,(value_type *)&local_498);
              String::String(&local_4b0,*(char **)((long)&this_00->super_TestCaseData + 0x28));
              std::
              set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>::
              insert((set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                      *)local_3e0,&local_4b0);
              String::~String(&local_4b0);
              *(int *)&this->p->field_0x94 = *(int *)&this->p->field_0x94 + 1;
            }
          }
        }
        else {
          local_478 = this_00;
          std::vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
          ::push_back((vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                       *)&__range2_1,(value_type *)&local_478);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
      ::operator++(&__end1_3);
    }
    if ((queryResults.
         super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
      pvVar19 = &detail::g_cs->reporters_currently_used;
      __end2_2 = std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                           (pvVar19);
      curr_rep_7 = (IReporter **)
                   std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end
                             (pvVar19);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2_2,
                                (__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                 *)&curr_rep_7), bVar3) {
        qdata._16_8_ = __gnu_cxx::
                       __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                       ::operator*(&__end2_2);
        (*(*(IReporter **)qdata._16_8_)->_vptr_IReporter[2])
                  (*(IReporter **)qdata._16_8_,&(detail::g_cs->super_ContextOptions).field_0x8c);
        __gnu_cxx::
        __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
        ::operator++(&__end2_2);
      }
    }
    else {
      QueryData::QueryData((QueryData *)&__range2_3);
      local_710 = (vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)0x0;
      if (detail::g_cs != (ContextState *)0x0) {
        local_710 = (vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)
                    &(detail::g_cs->super_ContextOptions).field_0x8c;
      }
      __range2_3 = local_710;
      qdata.run_stats =
           (TestRunStats *)
           std::
           vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>::
           data((vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                 *)&__range2_1);
      sVar11 = std::
               vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
               ::size((vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                       *)&__range2_1);
      qdata.data._0_4_ = (undefined4)sVar11;
      pvVar19 = &detail::g_cs->reporters_currently_used;
      __end2_3 = std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                           (pvVar19);
      curr_rep_8 = (IReporter **)
                   std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end
                             (pvVar19);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2_3,
                                (__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                 *)&curr_rep_8), bVar3) {
        ppIStack_5c8 = __gnu_cxx::
                       __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                       ::operator*(&__end2_3);
        (**(*ppIStack_5c8)->_vptr_IReporter)(*ppIStack_5c8,&__range2_3);
        __gnu_cxx::
        __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
        ::operator++(&__end2_3);
      }
    }
    run::anon_class_1_0_00000001::operator()(&local_5c9);
    this_local._4_4_ =
         run::anon_class_24_3_e7807fc8::operator()((anon_class_24_3_e7807fc8 *)local_258);
    testArray.
    super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    std::vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>::
    ~vector((vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_> *
            )&__range2_1);
    std::set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>::~set
              ((set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_> *
               )local_3e0);
    std::
    vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>::
    ~vector((vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
             *)&__range1_2);
  }
  else {
    pvVar19 = &detail::g_cs->reporters_currently_used;
    __end2 = std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                       (pvVar19);
    curr_rep = (IReporter **)
               std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end
                         (pvVar19);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                       *)&curr_rep), bVar3) {
      local_2f8 = __gnu_cxx::
                  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                  ::operator*(&__end2);
      pIVar2 = *local_2f8;
      local_318.run_stats = (TestRunStats *)0x0;
      local_318.data = (TestCaseData **)0x0;
      local_318.num_data = 0;
      local_318._20_4_ = 0;
      QueryData::QueryData(&local_318);
      (**pIVar2->_vptr_IReporter)(pIVar2,&local_318);
      __gnu_cxx::
      __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
      ::operator++(&__end2);
    }
    this_local._4_4_ =
         run::anon_class_24_3_e7807fc8::operator()((anon_class_24_3_e7807fc8 *)local_258);
    testArray.
    super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  std::fstream::~fstream(local_230);
  return this_local._4_4_;
}

Assistant:

int Context::run() {
    using namespace detail;

    // save the old context state in case such was setup - for using asserts out of a testing context
    auto old_cs = g_cs;
    // this is the current contest
    g_cs               = p;
    is_running_in_test = true;

    g_no_colors = p->no_colors;
    p->resetRunData();

    // stdout by default
    p->cout = &std::cout;
    p->cerr = &std::cerr;

    // or to a file if specified
    std::fstream fstr;
    if(p->out.size()) {
        fstr.open(p->out.c_str(), std::fstream::out);
        p->cout = &fstr;
    }

    FatalConditionHandler::allocateAltStackMem();

    auto cleanup_and_return = [&]() {
        FatalConditionHandler::freeAltStackMem();

        if(fstr.is_open())
            fstr.close();

        // restore context
        g_cs               = old_cs;
        is_running_in_test = false;

        // we have to free the reporters which were allocated when the run started
        for(auto& curr : p->reporters_currently_used)
            delete curr;
        p->reporters_currently_used.clear();

        if(p->numTestCasesFailed && !p->no_exitcode)
            return EXIT_FAILURE;
        return EXIT_SUCCESS;
    };

    // setup default reporter if none is given through the command line
    if(p->filters[8].empty())
        p->filters[8].push_back("console");

    // check to see if any of the registered reporters has been selected
    for(auto& curr : getReporters()) {
        if(matchesAny(curr.first.second.c_str(), p->filters[8], false, p->case_sensitive))
            p->reporters_currently_used.push_back(curr.second(*g_cs));
    }

    // TODO: check if there is nothing in reporters_currently_used

    // prepend all listeners
    for(auto& curr : getListeners())
        p->reporters_currently_used.insert(p->reporters_currently_used.begin(), curr.second(*g_cs));

#ifdef DOCTEST_PLATFORM_WINDOWS
    if(isDebuggerActive() && p->no_debug_output == false)
        p->reporters_currently_used.push_back(new DebugOutputWindowReporter(*g_cs));
#endif // DOCTEST_PLATFORM_WINDOWS

    // handle version, help and no_run
    if(p->no_run || p->version || p->help || p->list_reporters) {
        DOCTEST_ITERATE_THROUGH_REPORTERS(report_query, QueryData());

        return cleanup_and_return();
    }

    std::vector<const TestCase*> testArray;
    for(auto& curr : getRegisteredTests())
        testArray.push_back(&curr);
    p->numTestCases = testArray.size();

    // sort the collected records
    if(!testArray.empty()) {
        if(p->order_by.compare("file", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), fileOrderComparator);
        } else if(p->order_by.compare("suite", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), suiteOrderComparator);
        } else if(p->order_by.compare("name", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), nameOrderComparator);
        } else if(p->order_by.compare("rand", true) == 0) {
            std::srand(p->rand_seed);

            // random_shuffle implementation
            const auto first = &testArray[0];
            for(size_t i = testArray.size() - 1; i > 0; --i) {
                int idxToSwap = std::rand() % (i + 1); // NOLINT

                const auto temp = first[i];

                first[i]         = first[idxToSwap];
                first[idxToSwap] = temp;
            }
        } else if(p->order_by.compare("none", true) == 0) {
            // means no sorting - beneficial for death tests which call into the executable
            // with a specific test case in mind - we don't want to slow down the startup times
        }
    }

    std::set<String> testSuitesPassingFilt;

    bool                             query_mode = p->count || p->list_test_cases || p->list_test_suites;
    std::vector<const TestCaseData*> queryResults;

    if(!query_mode)
        DOCTEST_ITERATE_THROUGH_REPORTERS(test_run_start, DOCTEST_EMPTY);

    // invoke the registered functions if they match the filter criteria (or just count them)
    for(auto& curr : testArray) {
        const auto& tc = *curr;

        bool skip_me = false;
        if(tc.m_skip && !p->no_skip)
            skip_me = true;

        if(!matchesAny(tc.m_file.c_str(), p->filters[0], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_file.c_str(), p->filters[1], false, p->case_sensitive))
            skip_me = true;
        if(!matchesAny(tc.m_test_suite, p->filters[2], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_test_suite, p->filters[3], false, p->case_sensitive))
            skip_me = true;
        if(!matchesAny(tc.m_name, p->filters[4], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_name, p->filters[5], false, p->case_sensitive))
            skip_me = true;

        if(!skip_me)
            p->numTestCasesPassingFilters++;

        // skip the test if it is not in the execution range
        if((p->last < p->numTestCasesPassingFilters && p->first <= p->last) ||
           (p->first > p->numTestCasesPassingFilters))
            skip_me = true;

        if(skip_me) {
            if(!query_mode)
                DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_skipped, tc);
            continue;
        }

        // do not execute the test if we are to only count the number of filter passing tests
        if(p->count)
            continue;

        // print the name of the test and don't execute it
        if(p->list_test_cases) {
            queryResults.push_back(&tc);
            continue;
        }

        // print the name of the test suite if not done already and don't execute it
        if(p->list_test_suites) {
            if((testSuitesPassingFilt.count(tc.m_test_suite) == 0) && tc.m_test_suite[0] != '\0') {
                queryResults.push_back(&tc);
                testSuitesPassingFilt.insert(tc.m_test_suite);
                p->numTestSuitesPassingFilters++;
            }
            continue;
        }

        // execute the test if it passes all the filtering
        {
            p->currentTest = &tc;

            p->failure_flags = TestCaseFailureReason::None;
            p->seconds       = 0;

            // reset atomic counters
            p->numAssertsFailedCurrentTest_atomic = 0;
            p->numAssertsCurrentTest_atomic       = 0;

            p->subcasesPassed.clear();

            DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_start, tc);

            p->timer.start();
            
            bool run_test = true;

            do {
                // reset some of the fields for subcases (except for the set of fully passed ones)
                p->should_reenter          = false;
                p->subcasesCurrentMaxLevel = 0;
                p->subcasesStack.clear();

                p->shouldLogCurrentException = true;

                // reset stuff for logging with INFO()
                p->stringifiedContexts.clear();

#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
                try {
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS
// MSVC 2015 diagnoses fatalConditionHandler as unused (because reset() is a static method)
DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4101) // unreferenced local variable
                    FatalConditionHandler fatalConditionHandler; // Handle signals
                    // execute the test
                    tc.m_test();
                    fatalConditionHandler.reset();
DOCTEST_MSVC_SUPPRESS_WARNING_POP
#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
                } catch(const TestFailureException&) {
                    p->failure_flags |= TestCaseFailureReason::AssertFailure;
                } catch(...) {
                    DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_exception,
                                                      {translateActiveException(), false});
                    p->failure_flags |= TestCaseFailureReason::Exception;
                }
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS

                // exit this loop if enough assertions have failed - even if there are more subcases
                if(p->abort_after > 0 &&
                   p->numAssertsFailed + p->numAssertsFailedCurrentTest_atomic >= p->abort_after) {
                    run_test = false;
                    p->failure_flags |= TestCaseFailureReason::TooManyFailedAsserts;
                }
                
                if(p->should_reenter && run_test)
                    DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_reenter, tc);
                if(!p->should_reenter)
                    run_test = false;
            } while(run_test);

            p->finalizeTestCaseData();

            DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_end, *g_cs);

            p->currentTest = nullptr;

            // stop executing tests if enough assertions have failed
            if(p->abort_after > 0 && p->numAssertsFailed >= p->abort_after)
                break;
        }
    }

    if(!query_mode) {
        DOCTEST_ITERATE_THROUGH_REPORTERS(test_run_end, *g_cs);
    } else {
        QueryData qdata;
        qdata.run_stats = g_cs;
        qdata.data      = queryResults.data();
        qdata.num_data  = unsigned(queryResults.size());
        DOCTEST_ITERATE_THROUGH_REPORTERS(report_query, qdata);
    }

    // see these issues on the reasoning for this:
    // - https://github.com/onqtam/doctest/issues/143#issuecomment-414418903
    // - https://github.com/onqtam/doctest/issues/126
    auto DOCTEST_FIX_FOR_MACOS_LIBCPP_IOSFWD_STRING_LINK_ERRORS = []() DOCTEST_NOINLINE
        { std::cout << std::string(); };
    DOCTEST_FIX_FOR_MACOS_LIBCPP_IOSFWD_STRING_LINK_ERRORS();

    return cleanup_and_return();
}